

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  long lVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  float fVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  uint uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  int iVar24;
  int iVar25;
  int iVar26;
  undefined1 (*pauVar27) [16];
  byte bVar28;
  long lVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  Geometry *geometry;
  undefined1 (*pauVar41) [16];
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  byte bVar46;
  uint uVar47;
  ulong uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined4 uVar85;
  vint4 ai_1;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  vint4 ai;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar100;
  float fVar104;
  float fVar105;
  vint4 ai_3;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar106;
  float fVar107;
  float fVar111;
  float fVar112;
  vint4 ai_2;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar110 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [64];
  vint4 ai_4;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  vint4 ai_6;
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar129 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  RTCFilterFunctionNArguments args;
  vfloat<4> dist;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  ulong local_1330;
  ulong local_1328;
  ulong local_1320;
  ulong local_1318;
  ulong local_1310;
  ulong local_1308;
  long local_1300;
  long local_12f8;
  ulong local_12f0;
  ulong local_12e8;
  ulong local_12e0;
  ulong local_12d8;
  ulong local_12d0;
  undefined1 (*local_12c8) [16];
  long local_12c0;
  ulong local_12b8;
  RTCFilterFunctionNArguments local_12b0;
  undefined1 local_1280 [16];
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  byte local_111f;
  float local_1100 [4];
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  undefined4 uStack_10e4;
  float local_10e0 [4];
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  float fStack_10c4;
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  int local_1030;
  int iStack_102c;
  int iStack_1028;
  int iStack_1024;
  undefined1 local_1020 [16];
  undefined1 local_1010 [16];
  undefined1 local_1000 [16];
  undefined1 local_ff0 [16];
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined1 local_fd0 [16];
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar41 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  auVar49 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar137 = ZEXT1664(auVar49);
  auVar50 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar138 = ZEXT1664(auVar50);
  auVar51 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar139 = ZEXT1664(auVar51);
  auVar49 = vmulss_avx512f(auVar49,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar52._0_4_ = auVar49._0_4_;
  auVar52._4_4_ = auVar52._0_4_;
  auVar52._8_4_ = auVar52._0_4_;
  auVar52._12_4_ = auVar52._0_4_;
  auVar49 = vmulss_avx512f(auVar50,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar50._0_4_ = auVar49._0_4_;
  auVar50._4_4_ = auVar50._0_4_;
  auVar50._8_4_ = auVar50._0_4_;
  auVar50._12_4_ = auVar50._0_4_;
  auVar49 = vmulss_avx512f(auVar51,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar51._0_4_ = auVar49._0_4_;
  auVar51._4_4_ = auVar51._0_4_;
  auVar51._8_4_ = auVar51._0_4_;
  auVar51._12_4_ = auVar51._0_4_;
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar39 = uVar36 ^ 0x10;
  uVar42 = uVar37 ^ 0x10;
  uVar35 = uVar38 ^ 0x10;
  auVar49 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar140 = ZEXT1664(auVar49);
  auVar108._8_4_ = 0x80000000;
  auVar108._0_8_ = 0x8000000080000000;
  auVar108._12_4_ = 0x80000000;
  auVar49 = vxorps_avx512vl(auVar52,auVar108);
  auVar141 = ZEXT1664(auVar49);
  auVar49 = vxorps_avx512vl(auVar50,auVar108);
  auVar142 = ZEXT1664(auVar49);
  auVar49 = vxorps_avx512vl(auVar51,auVar108);
  auVar143 = ZEXT1664(auVar49);
  auVar49 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar144 = ZEXT1664(auVar49);
  local_1308 = uVar36 >> 2;
  local_1310 = uVar39 >> 2;
  local_1318 = uVar37 >> 2;
  local_1320 = uVar42 >> 2;
  local_1328 = uVar38 >> 2;
  local_1330 = uVar35 >> 2;
  auVar49 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
  auVar145 = ZEXT1664(auVar49);
  auVar67 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar146 = ZEXT3264(auVar67);
  local_11e0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_12f0 = uVar42;
  local_12e8 = uVar39;
  local_12e0 = uVar38;
  local_12d8 = uVar37;
  local_12d0 = uVar36;
LAB_01ced77c:
  do {
    do {
      if (pauVar41 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar27 = pauVar41 + -1;
      pauVar41 = pauVar41 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)((long)*pauVar27 + 8));
    uVar48 = *(size_t *)*pauVar41;
    while ((uVar48 & 8) == 0) {
      auVar49 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar48 + 0x20 + uVar36),auVar141._0_16_,
                           auVar137._0_16_);
      auVar50 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar48 + 0x20 + uVar37),auVar142._0_16_,
                           auVar138._0_16_);
      auVar49 = vpmaxsd_avx(auVar49,auVar50);
      auVar51 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar48 + 0x20 + uVar38),auVar143._0_16_,
                           auVar139._0_16_);
      auVar50 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar48 + 0x20 + uVar39),auVar141._0_16_,
                           auVar137._0_16_);
      auVar52 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar48 + 0x20 + uVar42),auVar142._0_16_,
                           auVar138._0_16_);
      auVar50 = vpminsd_avx(auVar50,auVar52);
      auVar52 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar48 + 0x20 + uVar35),auVar143._0_16_,
                           auVar139._0_16_);
      auVar51 = vpmaxsd_avx512vl(auVar51,auVar144._0_16_);
      auVar49 = vpmaxsd_avx(auVar49,auVar51);
      auVar51 = vpminsd_avx512vl(auVar52,auVar140._0_16_);
      auVar50 = vpminsd_avx(auVar50,auVar51);
      uVar45 = vpcmpd_avx512vl(auVar49,auVar50,2);
      uVar45 = uVar45 & 0xf;
      local_11a0._0_16_ = auVar49;
      if ((char)uVar45 == '\0') goto LAB_01ced77c;
      uVar44 = uVar48 & 0xfffffffffffffff0;
      lVar29 = 0;
      for (uVar48 = uVar45; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
        lVar29 = lVar29 + 1;
      }
      uVar48 = *(ulong *)(uVar44 + lVar29 * 8);
      uVar30 = (uint)uVar45 - 1 & (uint)uVar45;
      uVar45 = (ulong)uVar30;
      if (uVar30 != 0) {
        uVar32 = *(uint *)(local_11a0 + lVar29 * 4);
        lVar29 = 0;
        for (; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
          lVar29 = lVar29 + 1;
        }
        uVar30 = uVar30 - 1 & uVar30;
        uVar33 = (ulong)uVar30;
        uVar45 = *(ulong *)(uVar44 + lVar29 * 8);
        uVar47 = *(uint *)(local_11a0 + lVar29 * 4);
        if (uVar30 == 0) {
          if (uVar32 < uVar47) {
            *(ulong *)*pauVar41 = uVar45;
            *(uint *)((long)*pauVar41 + 8) = uVar47;
            pauVar41 = pauVar41 + 1;
          }
          else {
            *(ulong *)*pauVar41 = uVar48;
            *(uint *)((long)*pauVar41 + 8) = uVar32;
            pauVar41 = pauVar41 + 1;
            uVar48 = uVar45;
          }
        }
        else {
          auVar49._8_8_ = 0;
          auVar49._0_8_ = uVar48;
          auVar49 = vpunpcklqdq_avx(auVar49,ZEXT416(uVar32));
          auVar94._8_8_ = 0;
          auVar94._0_8_ = uVar45;
          auVar50 = vpunpcklqdq_avx(auVar94,ZEXT416(uVar47));
          lVar29 = 0;
          for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
            lVar29 = lVar29 + 1;
          }
          uVar30 = uVar30 - 1 & uVar30;
          uVar48 = (ulong)uVar30;
          auVar95._8_8_ = 0;
          auVar95._0_8_ = *(ulong *)(uVar44 + lVar29 * 8);
          auVar94 = vpunpcklqdq_avx(auVar95,ZEXT416(*(uint *)(local_11a0 + lVar29 * 4)));
          auVar51 = vpshufd_avx(auVar49,0xaa);
          auVar52 = vpshufd_avx(auVar50,0xaa);
          auVar108 = vpshufd_avx(auVar94,0xaa);
          if (uVar30 == 0) {
            uVar48 = vpcmpgtd_avx512vl(auVar52,auVar51);
            uVar48 = uVar48 & 0xf;
            auVar52 = vpblendmd_avx512vl(auVar50,auVar49);
            bVar7 = (bool)((byte)uVar48 & 1);
            auVar53._0_4_ = (uint)bVar7 * auVar52._0_4_ | (uint)!bVar7 * auVar51._0_4_;
            bVar7 = (bool)((byte)(uVar48 >> 1) & 1);
            auVar53._4_4_ = (uint)bVar7 * auVar52._4_4_ | (uint)!bVar7 * auVar51._4_4_;
            bVar7 = (bool)((byte)(uVar48 >> 2) & 1);
            auVar53._8_4_ = (uint)bVar7 * auVar52._8_4_ | (uint)!bVar7 * auVar51._8_4_;
            bVar7 = SUB81(uVar48 >> 3,0);
            auVar53._12_4_ = (uint)bVar7 * auVar52._12_4_ | (uint)!bVar7 * auVar51._12_4_;
            auVar50 = vmovdqa32_avx512vl(auVar50);
            bVar7 = (bool)((byte)uVar48 & 1);
            auVar54._0_4_ = (uint)bVar7 * auVar50._0_4_ | (uint)!bVar7 * auVar49._0_4_;
            bVar7 = (bool)((byte)(uVar48 >> 1) & 1);
            auVar54._4_4_ = (uint)bVar7 * auVar50._4_4_ | (uint)!bVar7 * auVar49._4_4_;
            bVar7 = (bool)((byte)(uVar48 >> 2) & 1);
            auVar54._8_4_ = (uint)bVar7 * auVar50._8_4_ | (uint)!bVar7 * auVar49._8_4_;
            bVar7 = SUB81(uVar48 >> 3,0);
            auVar54._12_4_ = (uint)bVar7 * auVar50._12_4_ | (uint)!bVar7 * auVar49._12_4_;
            auVar49 = vpshufd_avx(auVar53,0xaa);
            uVar45 = vpcmpgtd_avx512vl(auVar108,auVar49);
            uVar45 = uVar45 & 0xf;
            auVar50 = vpblendmd_avx512vl(auVar94,auVar53);
            bVar7 = (bool)((byte)uVar45 & 1);
            bVar8 = (bool)((byte)(uVar45 >> 1) & 1);
            uVar48 = CONCAT44((uint)bVar8 * auVar50._4_4_ | (uint)!bVar8 * auVar49._4_4_,
                              (uint)bVar7 * auVar50._0_4_ | (uint)!bVar7 * auVar49._0_4_);
            auVar49 = vmovdqa32_avx512vl(auVar94);
            bVar7 = (bool)((byte)uVar45 & 1);
            auVar55._0_4_ = (uint)bVar7 * auVar49._0_4_ | !bVar7 * auVar53._0_4_;
            bVar7 = (bool)((byte)(uVar45 >> 1) & 1);
            auVar55._4_4_ = (uint)bVar7 * auVar49._4_4_ | !bVar7 * auVar53._4_4_;
            bVar7 = (bool)((byte)(uVar45 >> 2) & 1);
            auVar55._8_4_ = (uint)bVar7 * auVar49._8_4_ | !bVar7 * auVar53._8_4_;
            bVar7 = SUB81(uVar45 >> 3,0);
            auVar55._12_4_ = (uint)bVar7 * auVar49._12_4_ | !bVar7 * auVar53._12_4_;
            auVar49 = vpshufd_avx(auVar55,0xaa);
            auVar50 = vpshufd_avx(auVar54,0xaa);
            uVar45 = vpcmpgtd_avx512vl(auVar49,auVar50);
            uVar45 = uVar45 & 0xf;
            auVar50 = vpblendmd_avx512vl(auVar55,auVar54);
            bVar7 = (bool)((byte)uVar45 & 1);
            auVar56._0_4_ = (uint)bVar7 * auVar50._0_4_ | (uint)!bVar7 * auVar49._0_4_;
            bVar7 = (bool)((byte)(uVar45 >> 1) & 1);
            auVar56._4_4_ = (uint)bVar7 * auVar50._4_4_ | (uint)!bVar7 * auVar49._4_4_;
            bVar7 = (bool)((byte)(uVar45 >> 2) & 1);
            auVar56._8_4_ = (uint)bVar7 * auVar50._8_4_ | (uint)!bVar7 * auVar49._8_4_;
            bVar7 = SUB81(uVar45 >> 3,0);
            auVar56._12_4_ = (uint)bVar7 * auVar50._12_4_ | (uint)!bVar7 * auVar49._12_4_;
            auVar49 = vmovdqa32_avx512vl(auVar55);
            bVar7 = (bool)((byte)uVar45 & 1);
            auVar57._0_4_ = (uint)bVar7 * auVar49._0_4_ | !bVar7 * auVar54._0_4_;
            bVar7 = (bool)((byte)(uVar45 >> 1) & 1);
            auVar57._4_4_ = (uint)bVar7 * auVar49._4_4_ | !bVar7 * auVar54._4_4_;
            bVar7 = (bool)((byte)(uVar45 >> 2) & 1);
            auVar57._8_4_ = (uint)bVar7 * auVar49._8_4_ | !bVar7 * auVar54._8_4_;
            bVar7 = SUB81(uVar45 >> 3,0);
            auVar57._12_4_ = (uint)bVar7 * auVar49._12_4_ | !bVar7 * auVar54._12_4_;
            *pauVar41 = auVar57;
            pauVar41[1] = auVar56;
            pauVar41 = pauVar41 + 2;
          }
          else {
            lVar29 = 0;
            for (; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
              lVar29 = lVar29 + 1;
            }
            uVar30 = *(uint *)(local_11a0 + lVar29 * 4);
            auVar123._8_8_ = 0;
            auVar123._0_8_ = *(ulong *)(uVar44 + lVar29 * 8);
            auVar95 = vpunpcklqdq_avx(auVar123,ZEXT416(uVar30));
            uVar48 = vpcmpgtd_avx512vl(auVar52,auVar51);
            uVar48 = uVar48 & 0xf;
            auVar52 = vpblendmd_avx512vl(auVar50,auVar49);
            bVar7 = (bool)((byte)uVar48 & 1);
            auVar58._0_4_ = (uint)bVar7 * auVar52._0_4_ | (uint)!bVar7 * auVar51._0_4_;
            bVar7 = (bool)((byte)(uVar48 >> 1) & 1);
            auVar58._4_4_ = (uint)bVar7 * auVar52._4_4_ | (uint)!bVar7 * auVar51._4_4_;
            bVar7 = (bool)((byte)(uVar48 >> 2) & 1);
            auVar58._8_4_ = (uint)bVar7 * auVar52._8_4_ | (uint)!bVar7 * auVar51._8_4_;
            bVar7 = SUB81(uVar48 >> 3,0);
            auVar58._12_4_ = (uint)bVar7 * auVar52._12_4_ | (uint)!bVar7 * auVar51._12_4_;
            auVar50 = vmovdqa32_avx512vl(auVar50);
            bVar7 = (bool)((byte)uVar48 & 1);
            auVar59._0_4_ = (uint)bVar7 * auVar50._0_4_ | (uint)!bVar7 * auVar49._0_4_;
            bVar7 = (bool)((byte)(uVar48 >> 1) & 1);
            auVar59._4_4_ = (uint)bVar7 * auVar50._4_4_ | (uint)!bVar7 * auVar49._4_4_;
            bVar7 = (bool)((byte)(uVar48 >> 2) & 1);
            auVar59._8_4_ = (uint)bVar7 * auVar50._8_4_ | (uint)!bVar7 * auVar49._8_4_;
            bVar7 = SUB81(uVar48 >> 3,0);
            auVar59._12_4_ = (uint)bVar7 * auVar50._12_4_ | (uint)!bVar7 * auVar49._12_4_;
            auVar101._4_4_ = uVar30;
            auVar101._0_4_ = uVar30;
            auVar101._8_4_ = uVar30;
            auVar101._12_4_ = uVar30;
            uVar48 = vpcmpgtd_avx512vl(auVar101,auVar108);
            uVar48 = uVar48 & 0xf;
            auVar49 = vpblendmd_avx512vl(auVar95,auVar94);
            bVar7 = (bool)((byte)uVar48 & 1);
            auVar60._0_4_ = (uint)bVar7 * auVar49._0_4_ | !bVar7 * uVar30;
            bVar7 = (bool)((byte)(uVar48 >> 1) & 1);
            auVar60._4_4_ = (uint)bVar7 * auVar49._4_4_ | !bVar7 * uVar30;
            bVar7 = (bool)((byte)(uVar48 >> 2) & 1);
            auVar60._8_4_ = (uint)bVar7 * auVar49._8_4_ | !bVar7 * uVar30;
            bVar7 = SUB81(uVar48 >> 3,0);
            auVar60._12_4_ = (uint)bVar7 * auVar49._12_4_ | !bVar7 * uVar30;
            auVar49 = vmovdqa32_avx512vl(auVar95);
            bVar7 = (bool)((byte)uVar48 & 1);
            auVar61._0_4_ = (uint)bVar7 * auVar49._0_4_ | (uint)!bVar7 * auVar94._0_4_;
            bVar7 = (bool)((byte)(uVar48 >> 1) & 1);
            auVar61._4_4_ = (uint)bVar7 * auVar49._4_4_ | (uint)!bVar7 * auVar94._4_4_;
            bVar7 = (bool)((byte)(uVar48 >> 2) & 1);
            auVar61._8_4_ = (uint)bVar7 * auVar49._8_4_ | (uint)!bVar7 * auVar94._8_4_;
            bVar7 = SUB81(uVar48 >> 3,0);
            auVar61._12_4_ = (uint)bVar7 * auVar49._12_4_ | (uint)!bVar7 * auVar94._12_4_;
            auVar49 = vpshufd_avx(auVar61,0xaa);
            auVar50 = vpshufd_avx(auVar59,0xaa);
            uVar48 = vpcmpgtd_avx512vl(auVar49,auVar50);
            uVar48 = uVar48 & 0xf;
            auVar50 = vpblendmd_avx512vl(auVar61,auVar59);
            bVar7 = (bool)((byte)uVar48 & 1);
            auVar62._0_4_ = (uint)bVar7 * auVar50._0_4_ | (uint)!bVar7 * auVar49._0_4_;
            bVar7 = (bool)((byte)(uVar48 >> 1) & 1);
            auVar62._4_4_ = (uint)bVar7 * auVar50._4_4_ | (uint)!bVar7 * auVar49._4_4_;
            bVar7 = (bool)((byte)(uVar48 >> 2) & 1);
            auVar62._8_4_ = (uint)bVar7 * auVar50._8_4_ | (uint)!bVar7 * auVar49._8_4_;
            bVar7 = SUB81(uVar48 >> 3,0);
            auVar62._12_4_ = (uint)bVar7 * auVar50._12_4_ | (uint)!bVar7 * auVar49._12_4_;
            auVar51 = vmovdqa32_avx512vl(auVar61);
            bVar7 = (bool)((byte)uVar48 & 1);
            bVar9 = (bool)((byte)(uVar48 >> 1) & 1);
            bVar11 = (bool)((byte)(uVar48 >> 2) & 1);
            bVar12 = SUB81(uVar48 >> 3,0);
            auVar49 = vpshufd_avx(auVar60,0xaa);
            auVar50 = vpshufd_avx(auVar58,0xaa);
            uVar45 = vpcmpgtd_avx512vl(auVar49,auVar50);
            uVar45 = uVar45 & 0xf;
            auVar50 = vpblendmd_avx512vl(auVar60,auVar58);
            bVar8 = (bool)((byte)uVar45 & 1);
            bVar10 = (bool)((byte)(uVar45 >> 1) & 1);
            uVar48 = CONCAT44((uint)bVar10 * auVar50._4_4_ | (uint)!bVar10 * auVar49._4_4_,
                              (uint)bVar8 * auVar50._0_4_ | (uint)!bVar8 * auVar49._0_4_);
            auVar49 = vmovdqa32_avx512vl(auVar60);
            bVar8 = (bool)((byte)uVar45 & 1);
            auVar63._0_4_ = (uint)bVar8 * auVar49._0_4_ | !bVar8 * auVar58._0_4_;
            bVar8 = (bool)((byte)(uVar45 >> 1) & 1);
            auVar63._4_4_ = (uint)bVar8 * auVar49._4_4_ | !bVar8 * auVar58._4_4_;
            bVar8 = (bool)((byte)(uVar45 >> 2) & 1);
            auVar63._8_4_ = (uint)bVar8 * auVar49._8_4_ | !bVar8 * auVar58._8_4_;
            bVar8 = SUB81(uVar45 >> 3,0);
            auVar63._12_4_ = (uint)bVar8 * auVar49._12_4_ | !bVar8 * auVar58._12_4_;
            auVar49 = vpshufd_avx(auVar63,0xaa);
            auVar50 = vpshufd_avx(auVar62,0xaa);
            uVar45 = vpcmpgtd_avx512vl(auVar50,auVar49);
            uVar45 = uVar45 & 0xf;
            auVar50 = vpblendmd_avx512vl(auVar62,auVar63);
            bVar8 = (bool)((byte)uVar45 & 1);
            auVar64._0_4_ = (uint)bVar8 * auVar50._0_4_ | (uint)!bVar8 * auVar49._0_4_;
            bVar8 = (bool)((byte)(uVar45 >> 1) & 1);
            auVar64._4_4_ = (uint)bVar8 * auVar50._4_4_ | (uint)!bVar8 * auVar49._4_4_;
            bVar8 = (bool)((byte)(uVar45 >> 2) & 1);
            auVar64._8_4_ = (uint)bVar8 * auVar50._8_4_ | (uint)!bVar8 * auVar49._8_4_;
            bVar8 = SUB81(uVar45 >> 3,0);
            auVar64._12_4_ = (uint)bVar8 * auVar50._12_4_ | (uint)!bVar8 * auVar49._12_4_;
            auVar49 = vmovdqa32_avx512vl(auVar62);
            bVar8 = (bool)((byte)uVar45 & 1);
            auVar65._0_4_ = (uint)bVar8 * auVar49._0_4_ | !bVar8 * auVar63._0_4_;
            bVar8 = (bool)((byte)(uVar45 >> 1) & 1);
            auVar65._4_4_ = (uint)bVar8 * auVar49._4_4_ | !bVar8 * auVar63._4_4_;
            bVar8 = (bool)((byte)(uVar45 >> 2) & 1);
            auVar65._8_4_ = (uint)bVar8 * auVar49._8_4_ | !bVar8 * auVar63._8_4_;
            bVar8 = SUB81(uVar45 >> 3,0);
            auVar65._12_4_ = (uint)bVar8 * auVar49._12_4_ | !bVar8 * auVar63._12_4_;
            *(uint *)*pauVar41 = (uint)bVar7 * auVar51._0_4_ | !bVar7 * auVar59._0_4_;
            *(uint *)((long)*pauVar41 + 4) = (uint)bVar9 * auVar51._4_4_ | !bVar9 * auVar59._4_4_;
            *(uint *)((long)*pauVar41 + 8) = (uint)bVar11 * auVar51._8_4_ | !bVar11 * auVar59._8_4_;
            *(uint *)((long)*pauVar41 + 0xc) =
                 (uint)bVar12 * auVar51._12_4_ | !bVar12 * auVar59._12_4_;
            pauVar41[1] = auVar65;
            pauVar41[2] = auVar64;
            pauVar41 = pauVar41 + 3;
          }
        }
      }
    }
    local_1300 = (ulong)((uint)uVar48 & 0xf) - 8;
    uVar48 = uVar48 & 0xfffffffffffffff0;
    local_12c8 = pauVar41;
    for (local_12f8 = 0; local_12f8 != local_1300; local_12f8 = local_12f8 + 1) {
      lVar29 = local_12f8 * 0x58;
      local_12c0 = uVar48 + lVar29;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = *(ulong *)(uVar48 + 0x20 + lVar29);
      auVar96._8_8_ = 0;
      auVar96._0_8_ = *(ulong *)(uVar48 + 0x24 + lVar29);
      uVar16 = vpcmpub_avx512vl(auVar86,auVar96,2);
      uVar85 = *(undefined4 *)(uVar48 + 0x38 + lVar29);
      auVar87._4_4_ = uVar85;
      auVar87._0_4_ = uVar85;
      auVar87._8_4_ = uVar85;
      auVar87._12_4_ = uVar85;
      uVar85 = *(undefined4 *)(uVar48 + 0x44 + lVar29);
      auVar97._4_4_ = uVar85;
      auVar97._0_4_ = uVar85;
      auVar97._8_4_ = uVar85;
      auVar97._12_4_ = uVar85;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = *(ulong *)(local_1308 + 0x20 + local_12c0);
      auVar49 = vpmovzxbd_avx(auVar102);
      auVar49 = vcvtdq2ps_avx(auVar49);
      auVar50 = vfmadd213ps_fma(auVar49,auVar97,auVar87);
      auVar109._8_8_ = 0;
      auVar109._0_8_ = *(ulong *)(local_1310 + 0x20 + local_12c0);
      auVar49 = vpmovzxbd_avx(auVar109);
      auVar49 = vcvtdq2ps_avx(auVar49);
      auVar51 = vfmadd213ps_fma(auVar49,auVar97,auVar87);
      uVar85 = *(undefined4 *)(uVar48 + 0x3c + lVar29);
      auVar88._4_4_ = uVar85;
      auVar88._0_4_ = uVar85;
      auVar88._8_4_ = uVar85;
      auVar88._12_4_ = uVar85;
      uVar85 = *(undefined4 *)(uVar48 + 0x48 + lVar29);
      auVar98._4_4_ = uVar85;
      auVar98._0_4_ = uVar85;
      auVar98._8_4_ = uVar85;
      auVar98._12_4_ = uVar85;
      auVar117._8_8_ = 0;
      auVar117._0_8_ = *(ulong *)(local_1318 + 0x20 + local_12c0);
      auVar49 = vpmovzxbd_avx(auVar117);
      auVar49 = vcvtdq2ps_avx(auVar49);
      auVar52 = vfmadd213ps_fma(auVar49,auVar98,auVar88);
      auVar120._8_8_ = 0;
      auVar120._0_8_ = *(ulong *)(local_1320 + 0x20 + local_12c0);
      auVar49 = vpmovzxbd_avx(auVar120);
      auVar49 = vcvtdq2ps_avx(auVar49);
      auVar108 = vfmadd213ps_fma(auVar49,auVar98,auVar88);
      uVar85 = *(undefined4 *)(uVar48 + 0x40 + lVar29);
      auVar89._4_4_ = uVar85;
      auVar89._0_4_ = uVar85;
      auVar89._8_4_ = uVar85;
      auVar89._12_4_ = uVar85;
      uVar85 = *(undefined4 *)(uVar48 + 0x4c + lVar29);
      auVar99._4_4_ = uVar85;
      auVar99._0_4_ = uVar85;
      auVar99._8_4_ = uVar85;
      auVar99._12_4_ = uVar85;
      auVar124._8_8_ = 0;
      auVar124._0_8_ = *(ulong *)(local_1328 + 0x20 + local_12c0);
      auVar49 = vpmovzxbd_avx(auVar124);
      auVar49 = vcvtdq2ps_avx(auVar49);
      auVar94 = vfmadd213ps_fma(auVar49,auVar99,auVar89);
      auVar125._8_8_ = 0;
      auVar125._0_8_ = *(ulong *)(local_1330 + 0x20 + local_12c0);
      auVar49 = vpmovzxbd_avx(auVar125);
      auVar49 = vcvtdq2ps_avx(auVar49);
      auVar95 = vfmadd213ps_fma(auVar49,auVar99,auVar89);
      auVar49 = vfmadd213ps_avx512vl(auVar50,auVar137._0_16_,auVar141._0_16_);
      auVar50 = vfmadd213ps_avx512vl(auVar52,auVar138._0_16_,auVar142._0_16_);
      auVar49 = vpmaxsd_avx(auVar49,auVar50);
      auVar52 = vfmadd213ps_avx512vl(auVar94,auVar139._0_16_,auVar143._0_16_);
      auVar50 = vfmadd213ps_avx512vl(auVar51,auVar137._0_16_,auVar141._0_16_);
      auVar51 = vfmadd213ps_avx512vl(auVar108,auVar138._0_16_,auVar142._0_16_);
      auVar50 = vpminsd_avx(auVar50,auVar51);
      auVar51 = vfmadd213ps_avx512vl(auVar95,auVar139._0_16_,auVar143._0_16_);
      auVar52 = vpmaxsd_avx512vl(auVar52,auVar144._0_16_);
      local_11d0 = vpmaxsd_avx(auVar49,auVar52);
      auVar49 = vpminsd_avx512vl(auVar51,auVar140._0_16_);
      auVar49 = vpminsd_avx(auVar50,auVar49);
      uVar17 = vpcmpd_avx512vl(local_11d0,auVar49,2);
      local_12b8 = CONCAT44((int)(local_1320 >> 0x20),(uint)((byte)uVar16 & 0xf & (byte)uVar17));
LAB_01cedb95:
      if (local_12b8 != 0) {
        lVar29 = 0;
        for (uVar45 = local_12b8; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
          lVar29 = lVar29 + 1;
        }
        local_12b8 = local_12b8 - 1 & local_12b8;
        fVar116 = *(float *)(ray + k * 4 + 0x80);
        if (*(float *)(local_11d0 + lVar29 * 4) <= fVar116) {
          uVar30 = *(uint *)(local_12c0 + 0x50);
          uVar32 = *(uint *)(local_12c0 + 4 + lVar29 * 8);
          pGVar3 = (context->scene->geometries).items[uVar30].ptr;
          lVar4 = *(long *)&pGVar3->field_0x58;
          lVar5 = *(long *)&pGVar3[1].time_range.upper;
          lVar34 = pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                   (ulong)uVar32;
          uVar36 = *(ulong *)(local_12c0 + lVar29 * 8);
          auVar90._8_8_ = 0;
          auVar90._0_8_ = uVar36;
          auVar49 = vpandq_avx512vl(auVar90,auVar145._0_16_);
          auVar94 = vpmovzxwd_avx(auVar49);
          auVar103._8_8_ = 0;
          auVar103._0_8_ = *(ulong *)(lVar4 + lVar34);
          auVar49 = vpaddd_avx(auVar103,auVar94);
          auVar50 = vpmulld_avx(auVar103,auVar94);
          auVar50 = vpsrlq_avx(auVar50,0x20);
          auVar49 = vpaddd_avx(auVar49,auVar50);
          lVar43 = CONCAT44((int)(uVar42 >> 0x20),auVar49._0_4_);
          p_Var6 = pGVar3[1].intersectionFilterN;
          auVar49 = *(undefined1 (*) [16])(lVar5 + (lVar43 + 1) * (long)p_Var6);
          uVar38 = *(ulong *)(lVar4 + lVar34) >> 0x20;
          lVar40 = uVar38 + lVar43 + 1;
          auVar50 = *(undefined1 (*) [16])(lVar5 + (uVar38 + lVar43) * (long)p_Var6);
          auVar51 = *(undefined1 (*) [16])(lVar5 + lVar40 * (long)p_Var6);
          uVar37 = (ulong)(-1 < (short)uVar36);
          auVar52 = *(undefined1 (*) [16])(lVar5 + (lVar43 + uVar37 + 1) * (long)p_Var6);
          lVar29 = uVar37 + lVar40;
          auVar108 = *(undefined1 (*) [16])(lVar5 + lVar29 * (long)p_Var6);
          uVar37 = 0;
          if (-1 < (short)(uVar36 >> 0x10)) {
            uVar37 = uVar38;
          }
          auVar95 = *(undefined1 (*) [16])(lVar5 + (uVar38 + lVar43 + uVar37) * (long)p_Var6);
          auVar58 = *(undefined1 (*) [16])(lVar5 + (lVar40 + uVar37) * (long)p_Var6);
          auVar77._16_16_ = *(undefined1 (*) [16])(lVar5 + (uVar37 + lVar29) * (long)p_Var6);
          auVar77._0_16_ = auVar51;
          auVar60 = vunpcklps_avx(auVar49,auVar108);
          auVar59 = vunpckhps_avx(auVar49,auVar108);
          auVar61 = vunpcklps_avx(auVar52,auVar51);
          auVar52 = vunpckhps_avx(auVar52,auVar51);
          auVar62 = vunpcklps_avx(auVar59,auVar52);
          auVar63 = vunpcklps_avx(auVar60,auVar61);
          auVar52 = vunpckhps_avx(auVar60,auVar61);
          auVar60 = vunpcklps_avx(auVar50,auVar58);
          auVar59 = vunpckhps_avx(auVar50,auVar58);
          auVar61 = vunpcklps_avx(auVar51,auVar95);
          auVar95 = vunpckhps_avx(auVar51,auVar95);
          auVar59 = vunpcklps_avx(auVar59,auVar95);
          auVar64 = vunpcklps_avx(auVar60,auVar61);
          auVar95 = vunpckhps_avx(auVar60,auVar61);
          auVar79._16_16_ = auVar58;
          auVar79._0_16_ = auVar50;
          auVar80._16_16_ = auVar108;
          auVar80._0_16_ = auVar49;
          auVar67 = vunpcklps_avx(auVar80,auVar79);
          auVar81._16_16_ = auVar51;
          auVar81._0_16_ = *(undefined1 (*) [16])(lVar5 + (long)p_Var6 * lVar43);
          auVar82 = vunpcklps_avx(auVar81,auVar77);
          auVar73 = vunpcklps_avx(auVar82,auVar67);
          auVar74 = vunpckhps_avx(auVar82,auVar67);
          auVar67 = vunpckhps_avx(auVar80,auVar79);
          auVar82 = vunpckhps_avx(auVar81,auVar77);
          auVar75 = vunpcklps_avx(auVar82,auVar67);
          auVar67._16_16_ = auVar63;
          auVar67._0_16_ = auVar63;
          auVar82._16_16_ = auVar52;
          auVar82._0_16_ = auVar52;
          auVar68._16_16_ = auVar62;
          auVar68._0_16_ = auVar62;
          auVar71._16_16_ = auVar64;
          auVar71._0_16_ = auVar64;
          auVar78._16_16_ = auVar95;
          auVar78._0_16_ = auVar95;
          auVar72._16_16_ = auVar59;
          auVar72._0_16_ = auVar59;
          auVar67 = vsubps_avx(auVar73,auVar67);
          auVar82 = vsubps_avx(auVar74,auVar82);
          auVar81 = vsubps_avx(auVar75,auVar68);
          auVar80 = vsubps_avx(auVar71,auVar73);
          auVar79 = vsubps_avx(auVar78,auVar74);
          auVar68 = vsubps_avx512vl(auVar72,auVar75);
          auVar69 = vmulps_avx512vl(auVar82,auVar68);
          auVar49 = vfmsub231ps_fma(auVar69,auVar79,auVar81);
          auVar70._4_4_ = auVar81._4_4_ * auVar80._4_4_;
          auVar70._0_4_ = auVar81._0_4_ * auVar80._0_4_;
          auVar70._8_4_ = auVar81._8_4_ * auVar80._8_4_;
          auVar70._12_4_ = auVar81._12_4_ * auVar80._12_4_;
          auVar70._16_4_ = auVar81._16_4_ * auVar80._16_4_;
          auVar70._20_4_ = auVar81._20_4_ * auVar80._20_4_;
          auVar70._24_4_ = auVar81._24_4_ * auVar80._24_4_;
          auVar70._28_4_ = auVar52._12_4_;
          auVar70 = vfmsub231ps_avx512vl(auVar70,auVar68,auVar67);
          auVar76._4_4_ = auVar67._4_4_ * auVar79._4_4_;
          auVar76._0_4_ = auVar67._0_4_ * auVar79._0_4_;
          auVar76._8_4_ = auVar67._8_4_ * auVar79._8_4_;
          auVar76._12_4_ = auVar67._12_4_ * auVar79._12_4_;
          auVar76._16_4_ = auVar67._16_4_ * auVar79._16_4_;
          auVar76._20_4_ = auVar67._20_4_ * auVar79._20_4_;
          auVar76._24_4_ = auVar67._24_4_ * auVar79._24_4_;
          auVar76._28_4_ = auVar62._12_4_;
          uVar85 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar129._4_4_ = uVar85;
          auVar129._0_4_ = uVar85;
          auVar129._8_4_ = uVar85;
          auVar129._12_4_ = uVar85;
          auVar129._16_4_ = uVar85;
          auVar129._20_4_ = uVar85;
          auVar129._24_4_ = uVar85;
          auVar129._28_4_ = uVar85;
          auVar71 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
          auVar72 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
          uVar85 = *(undefined4 *)(ray + k * 4);
          auVar69._4_4_ = uVar85;
          auVar69._0_4_ = uVar85;
          auVar69._8_4_ = uVar85;
          auVar69._12_4_ = uVar85;
          auVar69._16_4_ = uVar85;
          auVar69._20_4_ = uVar85;
          auVar69._24_4_ = uVar85;
          auVar69._28_4_ = uVar85;
          auVar69 = vsubps_avx512vl(auVar73,auVar69);
          auVar50 = vfmsub231ps_fma(auVar76,auVar80,auVar82);
          uVar85 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar73._4_4_ = uVar85;
          auVar73._0_4_ = uVar85;
          auVar73._8_4_ = uVar85;
          auVar73._12_4_ = uVar85;
          auVar73._16_4_ = uVar85;
          auVar73._20_4_ = uVar85;
          auVar73._24_4_ = uVar85;
          auVar73._28_4_ = uVar85;
          auVar73 = vsubps_avx512vl(auVar74,auVar73);
          uVar85 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar74._4_4_ = uVar85;
          auVar74._0_4_ = uVar85;
          auVar74._8_4_ = uVar85;
          auVar74._12_4_ = uVar85;
          auVar74._16_4_ = uVar85;
          auVar74._20_4_ = uVar85;
          auVar74._24_4_ = uVar85;
          auVar74._28_4_ = uVar85;
          auVar74 = vsubps_avx512vl(auVar75,auVar74);
          auVar75 = vmulps_avx512vl(auVar71,auVar74);
          auVar76 = vfmsub231ps_avx512vl(auVar75,auVar73,auVar72);
          auVar75 = vmulps_avx512vl(auVar72,auVar69);
          auVar77 = vfmsub231ps_avx512vl(auVar75,auVar74,auVar129);
          auVar75 = vmulps_avx512vl(auVar129,auVar73);
          auVar78 = vfmsub231ps_avx512vl(auVar75,auVar69,auVar71);
          auVar75 = vmulps_avx512vl(ZEXT1632(auVar50),auVar72);
          auVar75 = vfmadd231ps_avx512vl(auVar75,auVar70,auVar71);
          local_1140 = vfmadd231ps_avx512vl(auVar75,ZEXT1632(auVar49),auVar129);
          vandps_avx512vl(local_1140,auVar146._0_32_);
          auVar75._8_4_ = 0x80000000;
          auVar75._0_8_ = 0x8000000080000000;
          auVar75._12_4_ = 0x80000000;
          auVar75._16_4_ = 0x80000000;
          auVar75._20_4_ = 0x80000000;
          auVar75._24_4_ = 0x80000000;
          auVar75._28_4_ = 0x80000000;
          vandps_avx512vl(local_1140,auVar75);
          auVar75 = vmulps_avx512vl(auVar68,auVar78);
          auVar79 = vfmadd231ps_avx512vl(auVar75,auVar77,auVar79);
          auVar80 = vfmadd231ps_avx512vl(auVar79,auVar76,auVar80);
          fVar128 = local_1140._0_4_;
          auVar126._0_4_ = (float)((uint)fVar128 ^ auVar80._0_4_);
          fVar130 = local_1140._4_4_;
          auVar126._4_4_ = (float)((uint)fVar130 ^ auVar80._4_4_);
          fVar131 = local_1140._8_4_;
          auVar126._8_4_ = (float)((uint)fVar131 ^ auVar80._8_4_);
          fVar132 = local_1140._12_4_;
          auVar126._12_4_ = (float)((uint)fVar132 ^ auVar80._12_4_);
          fVar133 = local_1140._16_4_;
          auVar126._16_4_ = (float)((uint)fVar133 ^ auVar80._16_4_);
          fVar134 = local_1140._20_4_;
          auVar126._20_4_ = (float)((uint)fVar134 ^ auVar80._20_4_);
          fVar135 = local_1140._24_4_;
          auVar126._24_4_ = (float)((uint)fVar135 ^ auVar80._24_4_);
          uVar47 = local_1140._28_4_;
          auVar126._28_4_ = (float)(uVar47 ^ auVar80._28_4_);
          auVar81 = vmulps_avx512vl(auVar81,auVar78);
          auVar82 = vfmadd231ps_avx512vl(auVar81,auVar82,auVar77);
          auVar67 = vfmadd231ps_avx512vl(auVar82,auVar67,auVar76);
          auVar127._0_4_ = (float)((uint)fVar128 ^ auVar67._0_4_);
          auVar127._4_4_ = (float)((uint)fVar130 ^ auVar67._4_4_);
          auVar127._8_4_ = (float)((uint)fVar131 ^ auVar67._8_4_);
          auVar127._12_4_ = (float)((uint)fVar132 ^ auVar67._12_4_);
          auVar127._16_4_ = (float)((uint)fVar133 ^ auVar67._16_4_);
          auVar127._20_4_ = (float)((uint)fVar134 ^ auVar67._20_4_);
          auVar127._24_4_ = (float)((uint)fVar135 ^ auVar67._24_4_);
          auVar127._28_4_ = (float)(uVar47 ^ auVar67._28_4_);
          uVar16 = vcmpps_avx512vl(auVar126,ZEXT832(0) << 0x20,5);
          uVar17 = vcmpps_avx512vl(auVar127,ZEXT832(0) << 0x20,5);
          uVar14 = vcmpps_avx512vl(local_1140,ZEXT832(0) << 0x20,4);
          auVar136._0_4_ = auVar126._0_4_ + auVar127._0_4_;
          auVar136._4_4_ = auVar126._4_4_ + auVar127._4_4_;
          auVar136._8_4_ = auVar126._8_4_ + auVar127._8_4_;
          auVar136._12_4_ = auVar126._12_4_ + auVar127._12_4_;
          auVar136._16_4_ = auVar126._16_4_ + auVar127._16_4_;
          auVar136._20_4_ = auVar126._20_4_ + auVar127._20_4_;
          auVar136._24_4_ = auVar126._24_4_ + auVar127._24_4_;
          auVar136._28_4_ = auVar126._28_4_ + auVar127._28_4_;
          uVar15 = vcmpps_avx512vl(auVar136,local_1140,2);
          local_111f = (byte)uVar16 & (byte)uVar17 & (byte)uVar14 & (byte)uVar15;
          uVar36 = local_12d0;
          uVar37 = local_12d8;
          uVar38 = local_12e0;
          uVar39 = local_12e8;
          pauVar41 = local_12c8;
          uVar42 = local_12f0;
          if (local_111f != 0) {
            auVar21._4_4_ = auVar74._4_4_ * auVar50._4_4_;
            auVar21._0_4_ = auVar74._0_4_ * auVar50._0_4_;
            auVar21._8_4_ = auVar74._8_4_ * auVar50._8_4_;
            auVar21._12_4_ = auVar74._12_4_ * auVar50._12_4_;
            auVar21._16_4_ = auVar74._16_4_ * 0.0;
            auVar21._20_4_ = auVar74._20_4_ * 0.0;
            auVar21._24_4_ = auVar74._24_4_ * 0.0;
            auVar21._28_4_ = auVar74._28_4_;
            auVar51 = vfmadd213ps_fma(auVar73,auVar70,auVar21);
            auVar51 = vfmadd213ps_fma(auVar69,ZEXT1632(auVar49),ZEXT1632(auVar51));
            local_1160._0_4_ = (float)((uint)fVar128 ^ auVar51._0_4_);
            local_1160._4_4_ = (float)((uint)fVar130 ^ auVar51._4_4_);
            local_1160._8_4_ = (float)((uint)fVar131 ^ auVar51._8_4_);
            local_1160._12_4_ = (float)((uint)fVar132 ^ auVar51._12_4_);
            local_1160._16_4_ = fVar133;
            local_1160._20_4_ = fVar134;
            local_1160._24_4_ = fVar135;
            local_1160._28_4_ = uVar47;
            uVar85 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar19._4_4_ = uVar85;
            auVar19._0_4_ = uVar85;
            auVar19._8_4_ = uVar85;
            auVar19._12_4_ = uVar85;
            auVar19._16_4_ = uVar85;
            auVar19._20_4_ = uVar85;
            auVar19._24_4_ = uVar85;
            auVar19._28_4_ = uVar85;
            auVar67 = vmulps_avx512vl(local_1140,auVar19);
            auVar22._4_4_ = fVar116 * fVar130;
            auVar22._0_4_ = fVar116 * fVar128;
            auVar22._8_4_ = fVar116 * fVar131;
            auVar22._12_4_ = fVar116 * fVar132;
            auVar22._16_4_ = fVar116 * fVar133;
            auVar22._20_4_ = fVar116 * fVar134;
            auVar22._24_4_ = fVar116 * fVar135;
            auVar22._28_4_ = fVar116;
            uVar16 = vcmpps_avx512vl(local_1160,auVar22,2);
            uVar17 = vcmpps_avx512vl(auVar67,local_1160,1);
            local_111f = (byte)uVar16 & (byte)uVar17 & local_111f;
            uVar47 = (uint)local_111f;
            if (local_111f != 0) {
              auVar67 = vsubps_avx(local_1140,auVar127);
              auVar67 = vblendps_avx(auVar126,auVar67,0xf0);
              auVar82 = vsubps_avx(local_1140,auVar126);
              local_1180 = vblendps_avx(auVar127,auVar82,0xf0);
              local_10a0._0_4_ = auVar49._0_4_ * 1.0;
              local_10a0._4_4_ = auVar49._4_4_ * 1.0;
              local_10a0._8_4_ = auVar49._8_4_ * 1.0;
              local_10a0._12_4_ = auVar49._12_4_ * 1.0;
              local_10a0._16_4_ = 0x80000000;
              local_10a0._20_4_ = 0x80000000;
              local_10a0._24_4_ = 0x80000000;
              local_10a0._28_4_ = 0;
              local_1080._4_4_ = auVar70._4_4_ * 1.0;
              local_1080._0_4_ = auVar70._0_4_ * 1.0;
              local_1080._8_4_ = auVar70._8_4_ * 1.0;
              local_1080._12_4_ = auVar70._12_4_ * 1.0;
              local_1080._16_4_ = auVar70._16_4_ * -1.0;
              local_1080._20_4_ = auVar70._20_4_ * -1.0;
              local_1080._24_4_ = auVar70._24_4_ * -1.0;
              local_1080._28_4_ = 0;
              local_1060._4_4_ = auVar50._4_4_ * 1.0;
              local_1060._0_4_ = auVar50._0_4_ * 1.0;
              local_1060._8_4_ = auVar50._8_4_ * 1.0;
              local_1060._12_4_ = auVar50._12_4_ * 1.0;
              local_1060._16_4_ = 0x80000000;
              local_1060._20_4_ = 0x80000000;
              local_1060._24_4_ = 0x80000000;
              local_1060._28_4_ = 0;
              uVar85 = auVar94._0_4_;
              auVar110._4_4_ = uVar85;
              auVar110._0_4_ = uVar85;
              auVar110._8_4_ = uVar85;
              auVar110._12_4_ = uVar85;
              auVar110._16_4_ = uVar85;
              auVar110._20_4_ = uVar85;
              auVar110._24_4_ = uVar85;
              auVar110._28_4_ = uVar85;
              auVar82 = vpaddd_avx2(auVar110,_DAT_01fb7740);
              auVar118._0_4_ = (float)(int)(*(ushort *)(lVar4 + 8 + lVar34) - 1);
              auVar118._4_12_ = auVar94._4_12_;
              auVar121._4_12_ = ZEXT812(0) << 0x20;
              auVar121._0_4_ = auVar118._0_4_;
              auVar50 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar121);
              auVar49 = vfnmadd213ss_fma(auVar50,auVar118,ZEXT416(0x40000000));
              fVar116 = auVar49._0_4_ * auVar50._0_4_;
              auVar82 = vcvtdq2ps_avx(auVar82);
              fVar107 = (fVar128 * auVar82._0_4_ + auVar67._0_4_) * fVar116;
              fVar111 = (fVar130 * auVar82._4_4_ + auVar67._4_4_) * fVar116;
              local_11a0._4_4_ = fVar111;
              local_11a0._0_4_ = fVar107;
              fVar112 = (fVar131 * auVar82._8_4_ + auVar67._8_4_) * fVar116;
              local_11a0._8_4_ = fVar112;
              fVar113 = (fVar132 * auVar82._12_4_ + auVar67._12_4_) * fVar116;
              local_11a0._12_4_ = fVar113;
              fVar114 = (fVar133 * auVar82._16_4_ + auVar67._16_4_) * fVar116;
              local_11a0._16_4_ = fVar114;
              fVar115 = (fVar134 * auVar82._20_4_ + auVar67._20_4_) * fVar116;
              local_11a0._20_4_ = fVar115;
              fVar116 = (fVar135 * auVar82._24_4_ + auVar67._24_4_) * fVar116;
              local_11a0._24_4_ = fVar116;
              local_11a0._28_4_ = auVar82._28_4_ + auVar67._28_4_;
              if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                auVar119._8_4_ = 1;
                auVar119._0_8_ = 0x100000001;
                auVar119._12_4_ = 1;
                auVar119._16_4_ = 1;
                auVar119._20_4_ = 1;
                auVar119._24_4_ = 1;
                auVar119._28_4_ = 1;
                auVar67 = vpermd_avx2(auVar119,ZEXT1632(auVar94));
                auVar67 = vpaddd_avx2(auVar67,_DAT_01fb7760);
                auVar67 = vcvtdq2ps_avx(auVar67);
                local_1210 = auVar137._0_16_;
                auVar49 = vcvtsi2ss_avx512f(local_1210,*(ushort *)(lVar4 + 10 + lVar34) - 1);
                auVar23._12_4_ = 0;
                auVar23._0_12_ = ZEXT812(0);
                auVar50 = vrcp14ss_avx512f(auVar23 << 0x20,ZEXT416(auVar49._0_4_));
                auVar49 = vfnmadd213ss_fma(auVar50,auVar49,ZEXT416(0x40000000));
                fVar13 = auVar50._0_4_ * auVar49._0_4_;
                auVar82 = vrcp14ps_avx512vl(local_1140);
                auVar20._8_4_ = 0x3f800000;
                auVar20._0_8_ = 0x3f8000003f800000;
                auVar20._12_4_ = 0x3f800000;
                auVar20._16_4_ = 0x3f800000;
                auVar20._20_4_ = 0x3f800000;
                auVar20._24_4_ = 0x3f800000;
                auVar20._28_4_ = 0x3f800000;
                auVar81 = vfnmadd213ps_avx512vl(local_1140,auVar82,auVar20);
                auVar49 = vfmadd132ps_fma(auVar81,auVar82,auVar82);
                fVar100 = auVar49._0_4_;
                local_10c0._0_4_ = fVar100 * local_1160._0_4_;
                fVar104 = auVar49._4_4_;
                local_10c0._4_4_ = fVar104 * local_1160._4_4_;
                fVar105 = auVar49._8_4_;
                local_10c0._8_4_ = fVar105 * local_1160._8_4_;
                fVar106 = auVar49._12_4_;
                local_10c0._12_4_ = fVar106 * local_1160._12_4_;
                local_10c0._16_4_ = fVar133 * 0.0;
                local_10c0._20_4_ = fVar134 * 0.0;
                local_10c0._24_4_ = fVar135 * 0.0;
                local_10c0._28_4_ = 0;
                auVar122 = ZEXT3264(local_10c0);
                local_1100[0] = fVar107 * fVar100;
                local_1100[1] = fVar111 * fVar104;
                local_1100[2] = fVar112 * fVar105;
                local_1100[3] = fVar113 * fVar106;
                fStack_10f0 = fVar114 * 0.0;
                fStack_10ec = fVar115 * 0.0;
                fStack_10e8 = fVar116 * 0.0;
                uStack_10e4 = auVar82._28_4_;
                local_10e0[0] = (fVar128 * auVar67._0_4_ + local_1180._0_4_) * fVar13 * fVar100;
                local_10e0[1] = (fVar130 * auVar67._4_4_ + local_1180._4_4_) * fVar13 * fVar104;
                local_10e0[2] = (fVar131 * auVar67._8_4_ + local_1180._8_4_) * fVar13 * fVar105;
                local_10e0[3] = (fVar132 * auVar67._12_4_ + local_1180._12_4_) * fVar13 * fVar106;
                fStack_10d0 = (fVar133 * auVar67._16_4_ + local_1180._16_4_) * fVar13 * 0.0;
                fStack_10cc = (fVar134 * auVar67._20_4_ + local_1180._20_4_) * fVar13 * 0.0;
                fStack_10c8 = (fVar135 * auVar67._24_4_ + local_1180._24_4_) * fVar13 * 0.0;
                fStack_10c4 = auVar67._28_4_ + local_1180._28_4_;
                auVar91._8_4_ = 0x7f800000;
                auVar91._0_8_ = 0x7f8000007f800000;
                auVar91._12_4_ = 0x7f800000;
                auVar91._16_4_ = 0x7f800000;
                auVar91._20_4_ = 0x7f800000;
                auVar91._24_4_ = 0x7f800000;
                auVar91._28_4_ = 0x7f800000;
                auVar67 = vblendmps_avx512vl(auVar91,local_10c0);
                auVar83._0_4_ =
                     (uint)(local_111f & 1) * auVar67._0_4_ |
                     (uint)!(bool)(local_111f & 1) * 0x7f800000;
                bVar7 = (bool)(local_111f >> 1 & 1);
                auVar83._4_4_ = (uint)bVar7 * auVar67._4_4_ | (uint)!bVar7 * 0x7f800000;
                bVar7 = (bool)(local_111f >> 2 & 1);
                auVar83._8_4_ = (uint)bVar7 * auVar67._8_4_ | (uint)!bVar7 * 0x7f800000;
                bVar7 = (bool)(local_111f >> 3 & 1);
                auVar83._12_4_ = (uint)bVar7 * auVar67._12_4_ | (uint)!bVar7 * 0x7f800000;
                bVar7 = (bool)(local_111f >> 4 & 1);
                auVar83._16_4_ = (uint)bVar7 * auVar67._16_4_ | (uint)!bVar7 * 0x7f800000;
                bVar7 = (bool)(local_111f >> 5 & 1);
                auVar83._20_4_ = (uint)bVar7 * auVar67._20_4_ | (uint)!bVar7 * 0x7f800000;
                bVar7 = (bool)(local_111f >> 6 & 1);
                auVar83._24_4_ = (uint)bVar7 * auVar67._24_4_ | (uint)!bVar7 * 0x7f800000;
                auVar83._28_4_ =
                     (uint)(local_111f >> 7) * auVar67._28_4_ |
                     (uint)!(bool)(local_111f >> 7) * 0x7f800000;
                auVar67 = vshufps_avx(auVar83,auVar83,0xb1);
                auVar67 = vminps_avx(auVar83,auVar67);
                auVar82 = vshufpd_avx(auVar67,auVar67,5);
                auVar67 = vminps_avx(auVar67,auVar82);
                auVar82 = vpermpd_avx2(auVar67,0x4e);
                auVar67 = vminps_avx(auVar67,auVar82);
                uVar16 = vcmpps_avx512vl(auVar83,auVar67,0);
                uVar31 = uVar47;
                if ((local_111f & (byte)uVar16) != 0) {
                  uVar31 = (uint)(local_111f & (byte)uVar16);
                }
                uVar18 = 0;
                for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x80000000) {
                  uVar18 = uVar18 + 1;
                }
                uVar45 = (ulong)uVar18;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_11f0 = vpbroadcastd_avx512vl();
                  local_1200 = vpbroadcastd_avx512vl();
                  local_1350 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  local_11c0 = local_10c0;
                  local_1220 = auVar138._0_16_;
                  local_1230 = auVar139._0_16_;
                  local_1240 = vmovdqa64_avx512vl(auVar140._0_16_);
                  local_1250 = auVar141._0_16_;
                  local_1260 = auVar142._0_16_;
                  local_1270 = auVar143._0_16_;
                  local_1280 = vmovdqa64_avx512vl(auVar144._0_16_);
                  do {
                    fVar116 = local_1100[uVar45];
                    local_1000._4_4_ = fVar116;
                    local_1000._0_4_ = fVar116;
                    local_1000._8_4_ = fVar116;
                    local_1000._12_4_ = fVar116;
                    fVar116 = local_10e0[uVar45];
                    local_ff0._4_4_ = fVar116;
                    local_ff0._0_4_ = fVar116;
                    local_ff0._8_4_ = fVar116;
                    local_ff0._12_4_ = fVar116;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10c0 + uVar45 * 4);
                    local_12b0.context = context->user;
                    local_1030 = *(int *)(local_10a0 + uVar45 * 4);
                    uVar85 = *(undefined4 *)(local_1080 + uVar45 * 4);
                    local_1020._4_4_ = uVar85;
                    local_1020._0_4_ = uVar85;
                    local_1020._8_4_ = uVar85;
                    local_1020._12_4_ = uVar85;
                    uVar85 = *(undefined4 *)(local_1060 + uVar45 * 4);
                    local_1010._4_4_ = uVar85;
                    local_1010._0_4_ = uVar85;
                    local_1010._8_4_ = uVar85;
                    local_1010._12_4_ = uVar85;
                    iStack_102c = local_1030;
                    iStack_1028 = local_1030;
                    iStack_1024 = local_1030;
                    local_fe0 = local_1200._0_8_;
                    uStack_fd8 = local_1200._8_8_;
                    local_fd0 = local_11f0;
                    vpcmpeqd_avx2(ZEXT1632(local_11f0),ZEXT1632(local_11f0));
                    uStack_fbc = (local_12b0.context)->instID[0];
                    local_fc0 = uStack_fbc;
                    uStack_fb8 = uStack_fbc;
                    uStack_fb4 = uStack_fbc;
                    uStack_fb0 = (local_12b0.context)->instPrimID[0];
                    uStack_fac = uStack_fb0;
                    uStack_fa8 = uStack_fb0;
                    uStack_fa4 = uStack_fb0;
                    local_1340 = local_11e0;
                    local_12b0.valid = (int *)local_1340;
                    local_12b0.geometryUserPtr = pGVar3->userPtr;
                    local_12b0.hit = (RTCHitN *)&local_1030;
                    local_12b0.N = 4;
                    local_12b0.ray = (RTCRayN *)ray;
                    if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->intersectionFilterN)(&local_12b0);
                      auVar122 = ZEXT3264(local_11c0);
                      auVar67 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar146 = ZEXT3264(auVar67);
                      auVar49 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
                      auVar145 = ZEXT1664(auVar49);
                      auVar49 = vmovdqa64_avx512vl(local_1280);
                      auVar144 = ZEXT1664(auVar49);
                      auVar143 = ZEXT1664(local_1270);
                      auVar142 = ZEXT1664(local_1260);
                      auVar141 = ZEXT1664(local_1250);
                      auVar49 = vmovdqa64_avx512vl(local_1240);
                      auVar140 = ZEXT1664(auVar49);
                      auVar139 = ZEXT1664(local_1230);
                      auVar138 = ZEXT1664(local_1220);
                      auVar137 = ZEXT1664(local_1210);
                    }
                    uVar36 = vptestmd_avx512vl(local_1340,local_1340);
                    if ((uVar36 & 0xf) == 0) {
LAB_01cee4e1:
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_1350._0_4_;
                    }
                    else {
                      p_Var6 = context->args->filter;
                      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var6)(&local_12b0);
                        auVar122 = ZEXT3264(local_11c0);
                        auVar67 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar146 = ZEXT3264(auVar67);
                        auVar49 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
                        auVar145 = ZEXT1664(auVar49);
                        auVar49 = vmovdqa64_avx512vl(local_1280);
                        auVar144 = ZEXT1664(auVar49);
                        auVar143 = ZEXT1664(local_1270);
                        auVar142 = ZEXT1664(local_1260);
                        auVar141 = ZEXT1664(local_1250);
                        auVar49 = vmovdqa64_avx512vl(local_1240);
                        auVar140 = ZEXT1664(auVar49);
                        auVar139 = ZEXT1664(local_1230);
                        auVar138 = ZEXT1664(local_1220);
                        auVar137 = ZEXT1664(local_1210);
                      }
                      uVar36 = vptestmd_avx512vl(local_1340,local_1340);
                      uVar36 = uVar36 & 0xf;
                      bVar46 = (byte)uVar36;
                      if (bVar46 == 0) goto LAB_01cee4e1;
                      iVar24 = *(int *)(local_12b0.hit + 4);
                      iVar25 = *(int *)(local_12b0.hit + 8);
                      iVar26 = *(int *)(local_12b0.hit + 0xc);
                      bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar36 >> 2) & 1);
                      bVar9 = SUB81(uVar36 >> 3,0);
                      *(uint *)(local_12b0.ray + 0xc0) =
                           (uint)(bVar46 & 1) * *(int *)local_12b0.hit |
                           (uint)!(bool)(bVar46 & 1) * *(int *)(local_12b0.ray + 0xc0);
                      *(uint *)(local_12b0.ray + 0xc4) =
                           (uint)bVar7 * iVar24 | (uint)!bVar7 * *(int *)(local_12b0.ray + 0xc4);
                      *(uint *)(local_12b0.ray + 200) =
                           (uint)bVar8 * iVar25 | (uint)!bVar8 * *(int *)(local_12b0.ray + 200);
                      *(uint *)(local_12b0.ray + 0xcc) =
                           (uint)bVar9 * iVar26 | (uint)!bVar9 * *(int *)(local_12b0.ray + 0xcc);
                      iVar24 = *(int *)(local_12b0.hit + 0x14);
                      iVar25 = *(int *)(local_12b0.hit + 0x18);
                      iVar26 = *(int *)(local_12b0.hit + 0x1c);
                      bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar36 >> 2) & 1);
                      bVar9 = SUB81(uVar36 >> 3,0);
                      *(uint *)(local_12b0.ray + 0xd0) =
                           (uint)(bVar46 & 1) * *(int *)(local_12b0.hit + 0x10) |
                           (uint)!(bool)(bVar46 & 1) * *(int *)(local_12b0.ray + 0xd0);
                      *(uint *)(local_12b0.ray + 0xd4) =
                           (uint)bVar7 * iVar24 | (uint)!bVar7 * *(int *)(local_12b0.ray + 0xd4);
                      *(uint *)(local_12b0.ray + 0xd8) =
                           (uint)bVar8 * iVar25 | (uint)!bVar8 * *(int *)(local_12b0.ray + 0xd8);
                      *(uint *)(local_12b0.ray + 0xdc) =
                           (uint)bVar9 * iVar26 | (uint)!bVar9 * *(int *)(local_12b0.ray + 0xdc);
                      iVar24 = *(int *)(local_12b0.hit + 0x24);
                      iVar25 = *(int *)(local_12b0.hit + 0x28);
                      iVar26 = *(int *)(local_12b0.hit + 0x2c);
                      bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar36 >> 2) & 1);
                      bVar9 = SUB81(uVar36 >> 3,0);
                      *(uint *)(local_12b0.ray + 0xe0) =
                           (uint)(bVar46 & 1) * *(int *)(local_12b0.hit + 0x20) |
                           (uint)!(bool)(bVar46 & 1) * *(int *)(local_12b0.ray + 0xe0);
                      *(uint *)(local_12b0.ray + 0xe4) =
                           (uint)bVar7 * iVar24 | (uint)!bVar7 * *(int *)(local_12b0.ray + 0xe4);
                      *(uint *)(local_12b0.ray + 0xe8) =
                           (uint)bVar8 * iVar25 | (uint)!bVar8 * *(int *)(local_12b0.ray + 0xe8);
                      *(uint *)(local_12b0.ray + 0xec) =
                           (uint)bVar9 * iVar26 | (uint)!bVar9 * *(int *)(local_12b0.ray + 0xec);
                      iVar24 = *(int *)(local_12b0.hit + 0x34);
                      iVar25 = *(int *)(local_12b0.hit + 0x38);
                      iVar26 = *(int *)(local_12b0.hit + 0x3c);
                      bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar36 >> 2) & 1);
                      bVar9 = SUB81(uVar36 >> 3,0);
                      *(uint *)(local_12b0.ray + 0xf0) =
                           (uint)(bVar46 & 1) * *(int *)(local_12b0.hit + 0x30) |
                           (uint)!(bool)(bVar46 & 1) * *(int *)(local_12b0.ray + 0xf0);
                      *(uint *)(local_12b0.ray + 0xf4) =
                           (uint)bVar7 * iVar24 | (uint)!bVar7 * *(int *)(local_12b0.ray + 0xf4);
                      *(uint *)(local_12b0.ray + 0xf8) =
                           (uint)bVar8 * iVar25 | (uint)!bVar8 * *(int *)(local_12b0.ray + 0xf8);
                      *(uint *)(local_12b0.ray + 0xfc) =
                           (uint)bVar9 * iVar26 | (uint)!bVar9 * *(int *)(local_12b0.ray + 0xfc);
                      auVar49 = *(undefined1 (*) [16])(local_12b0.ray + 0x100);
                      auVar66._0_4_ =
                           (uint)(bVar46 & 1) * *(int *)(local_12b0.hit + 0x40) |
                           (uint)!(bool)(bVar46 & 1) * auVar49._0_4_;
                      bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
                      auVar66._4_4_ =
                           (uint)bVar7 * *(int *)(local_12b0.hit + 0x44) |
                           (uint)!bVar7 * auVar49._4_4_;
                      bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
                      auVar66._8_4_ =
                           (uint)bVar7 * *(int *)(local_12b0.hit + 0x48) |
                           (uint)!bVar7 * auVar49._8_4_;
                      bVar7 = SUB81(uVar36 >> 3,0);
                      auVar66._12_4_ =
                           (uint)bVar7 * *(int *)(local_12b0.hit + 0x4c) |
                           (uint)!bVar7 * auVar49._12_4_;
                      *(undefined1 (*) [16])(local_12b0.ray + 0x100) = auVar66;
                      auVar49 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_12b0.hit + 0x50));
                      *(undefined1 (*) [16])(local_12b0.ray + 0x110) = auVar49;
                      auVar49 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_12b0.hit + 0x60));
                      *(undefined1 (*) [16])(local_12b0.ray + 0x120) = auVar49;
                      auVar49 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_12b0.hit + 0x70));
                      *(undefined1 (*) [16])(local_12b0.ray + 0x130) = auVar49;
                      auVar49 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_12b0.hit + 0x80));
                      *(undefined1 (*) [16])(local_12b0.ray + 0x140) = auVar49;
                      local_1350._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_1350._4_4_ = 0;
                      local_1350._8_4_ = 0;
                      local_1350._12_4_ = 0;
                    }
                    bVar46 = ~(byte)(1 << ((uint)uVar45 & 0x1f)) & (byte)uVar47;
                    auVar92._4_4_ = local_1350._0_4_;
                    auVar92._0_4_ = local_1350._0_4_;
                    auVar92._8_4_ = local_1350._0_4_;
                    auVar92._12_4_ = local_1350._0_4_;
                    auVar92._16_4_ = local_1350._0_4_;
                    auVar92._20_4_ = local_1350._0_4_;
                    auVar92._24_4_ = local_1350._0_4_;
                    auVar92._28_4_ = local_1350._0_4_;
                    uVar16 = vcmpps_avx512vl(auVar122._0_32_,auVar92,2);
                    uVar36 = local_12d0;
                    uVar37 = local_12d8;
                    uVar38 = local_12e0;
                    uVar39 = local_12e8;
                    pauVar41 = local_12c8;
                    uVar42 = local_12f0;
                    if ((bVar46 & (byte)uVar16) == 0) goto LAB_01cedb95;
                    bVar46 = bVar46 & (byte)uVar16;
                    uVar47 = (uint)bVar46;
                    auVar93._8_4_ = 0x7f800000;
                    auVar93._0_8_ = 0x7f8000007f800000;
                    auVar93._12_4_ = 0x7f800000;
                    auVar93._16_4_ = 0x7f800000;
                    auVar93._20_4_ = 0x7f800000;
                    auVar93._24_4_ = 0x7f800000;
                    auVar93._28_4_ = 0x7f800000;
                    auVar67 = vblendmps_avx512vl(auVar93,auVar122._0_32_);
                    auVar84._0_4_ =
                         (uint)(bVar46 & 1) * auVar67._0_4_ | (uint)!(bool)(bVar46 & 1) * 0x7f800000
                    ;
                    bVar7 = (bool)(bVar46 >> 1 & 1);
                    auVar84._4_4_ = (uint)bVar7 * auVar67._4_4_ | (uint)!bVar7 * 0x7f800000;
                    bVar7 = (bool)(bVar46 >> 2 & 1);
                    auVar84._8_4_ = (uint)bVar7 * auVar67._8_4_ | (uint)!bVar7 * 0x7f800000;
                    bVar7 = (bool)(bVar46 >> 3 & 1);
                    auVar84._12_4_ = (uint)bVar7 * auVar67._12_4_ | (uint)!bVar7 * 0x7f800000;
                    bVar7 = (bool)(bVar46 >> 4 & 1);
                    auVar84._16_4_ = (uint)bVar7 * auVar67._16_4_ | (uint)!bVar7 * 0x7f800000;
                    bVar7 = (bool)(bVar46 >> 5 & 1);
                    auVar84._20_4_ = (uint)bVar7 * auVar67._20_4_ | (uint)!bVar7 * 0x7f800000;
                    bVar7 = (bool)(bVar46 >> 6 & 1);
                    auVar84._24_4_ = (uint)bVar7 * auVar67._24_4_ | (uint)!bVar7 * 0x7f800000;
                    auVar84._28_4_ =
                         (uint)(bVar46 >> 7) * auVar67._28_4_ |
                         (uint)!(bool)(bVar46 >> 7) * 0x7f800000;
                    auVar67 = vshufps_avx(auVar84,auVar84,0xb1);
                    auVar67 = vminps_avx(auVar84,auVar67);
                    auVar82 = vshufpd_avx(auVar67,auVar67,5);
                    auVar67 = vminps_avx(auVar67,auVar82);
                    auVar82 = vpermpd_avx2(auVar67,0x4e);
                    auVar67 = vminps_avx(auVar67,auVar82);
                    uVar16 = vcmpps_avx512vl(auVar84,auVar67,0);
                    bVar28 = (byte)uVar16 & bVar46;
                    if (bVar28 != 0) {
                      bVar46 = bVar28;
                    }
                    uVar30 = 0;
                    for (uVar32 = (uint)bVar46; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x80000000
                        ) {
                      uVar30 = uVar30 + 1;
                    }
                    uVar45 = (ulong)uVar30;
                  } while( true );
                }
                fVar116 = local_1100[uVar45];
                fVar128 = local_10e0[uVar45];
                uVar85 = *(undefined4 *)(local_10a0 + uVar45 * 4);
                uVar1 = *(undefined4 *)(local_1080 + uVar45 * 4);
                uVar2 = *(undefined4 *)(local_1060 + uVar45 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10c0 + uVar45 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) = uVar85;
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar2;
                *(float *)(ray + k * 4 + 0xf0) = fVar116;
                *(float *)(ray + k * 4 + 0x100) = fVar128;
                *(uint *)(ray + k * 4 + 0x110) = uVar32;
                *(uint *)(ray + k * 4 + 0x120) = uVar30;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
            }
          }
        }
        goto LAB_01cedb95;
      }
    }
    auVar49 = vpbroadcastd_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
    auVar140 = ZEXT1664(auVar49);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }